

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaTsim.c
# Opt level: O0

void Gia_ManTerStatesFree(Vec_Ptr_t *vStates)

{
  int iVar1;
  void *__ptr;
  int local_1c;
  int i;
  uint *pTemp;
  Vec_Ptr_t *vStates_local;
  
  for (local_1c = 0; iVar1 = Vec_PtrSize(vStates), local_1c < iVar1; local_1c = local_1c + 1) {
    __ptr = Vec_PtrEntry(vStates,local_1c);
    if (__ptr != (void *)0x0) {
      free(__ptr);
    }
  }
  Vec_PtrFree(vStates);
  return;
}

Assistant:

void Gia_ManTerStatesFree( Vec_Ptr_t * vStates )
{
    unsigned * pTemp;
    int i;
    Vec_PtrForEachEntry( unsigned *, vStates, pTemp, i )
        ABC_FREE( pTemp );
    Vec_PtrFree( vStates );
}